

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O3

void check_alt(char *arg_val_str,rtosc_print_options *opt,char *tc_base,int line,char *_exp_print)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *buffer;
  char strbuf [256];
  char tc_full [256];
  char local_238 [256];
  undefined8 local_138 [33];
  
  memset(local_238,0x7f,0x100);
  iVar1 = rtosc_count_printed_arg_vals(arg_val_str);
  sVar2 = rtosc_scan_arg_vals(arg_val_str,scanned,(long)iVar1,local_238,0x100);
  local_138[0] = CONCAT17(local_138[0]._7_1_,0x22206e616373);
  strncat((char *)local_138,tc_base,0xf9);
  sVar3 = strlen((char *)local_138);
  strncat((char *)local_138,"\" (read exactly the input string)",0x100 - sVar3);
  sVar3 = strlen(arg_val_str);
  assert_int_eq((int)sVar3,(int)sVar2,(char *)local_138,line);
  buffer = (char *)operator_new__(0x80);
  builtin_strncpy(buffer,
                  "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                  ,0x80);
  sVar2 = rtosc_print_arg_vals(scanned,(long)iVar1,buffer,0x80,opt,0);
  if (_exp_print == (char *)0x0) {
    _exp_print = arg_val_str;
  }
  local_138[0] = 0x2220746e697270;
  strncat((char *)local_138,tc_base,0xf8);
  sVar3 = strlen((char *)local_138);
  strncat((char *)local_138,"\" (value = value before scan)",0x100 - sVar3);
  assert_str_eq(_exp_print,buffer,(char *)local_138,line);
  operator_delete__(buffer);
  local_138[0] = 0x2220746e697270;
  strncat((char *)local_138,tc_base,0xf8);
  sVar3 = strlen((char *)local_138);
  strncat((char *)local_138,"\" (return value check)",0x100 - sVar3);
  sVar3 = strlen(_exp_print);
  assert_int_eq((int)sVar3,(int)sVar2,(char *)local_138,line);
  return;
}

Assistant:

void check_alt(const char* arg_val_str, const rtosc_print_options* opt,
               const char* tc_base, int line,
               const char* _exp_print)
{
    const int tc_len = BUF_LEN;
    char tc_full[BUF_LEN]; // descr. for full testcase name
    int strbuflen = BUF_LEN;
    char strbuf[BUF_LEN];
    memset(strbuf, 0x7f, strbuflen); /* init with rubbish */

    int num = rtosc_count_printed_arg_vals(arg_val_str);
    assert(num < 32);
    // note: when using this, the next step is usually
    //       rtosc_arg_val_t scanned[num];
    //       in this case, however, we need the variable globally accessible
    size_t rd = rtosc_scan_arg_vals(arg_val_str, scanned, num,
                                    strbuf, strbuflen);

    strcpy(tc_full, "scan \"");
    strncat(tc_full, tc_base, tc_len-7);
    strncat(tc_full, "\" (read exactly the input string)",
            tc_len - strlen(tc_full));
    assert_int_eq(strlen(arg_val_str), rd, tc_full, line);

    size_t len = 128;
    char* printed = new char[len];
    memset(printed, 0x7f, len); /* init with rubbish */
    size_t written = rtosc_print_arg_vals(scanned, num, printed, len, opt, 0);

    const char* exp_print = _exp_print ? _exp_print : arg_val_str;
    strcpy(tc_full, "print \"");
    strncat(tc_full, tc_base, tc_len-8);
    strncat(tc_full, "\" (value = value before scan)",
            tc_len - strlen(tc_full));
    assert_str_eq(exp_print, printed, tc_full, line);
    delete[] printed;

    strcpy(tc_full, "print \"");
    strncat(tc_full, tc_base, tc_len-8);
    strncat(tc_full, "\" (return value check)", tc_len - strlen(tc_full));
    assert_int_eq(strlen(exp_print), written, tc_full, line);
}